

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void __thiscall GLPortal::SaveMapSection(GLPortal *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar *__src;
  GLPortal *this_local;
  
  uVar1 = TArray<unsigned_char,_unsigned_char>::Size(&currentmapsection);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->savedmapsection,uVar1);
  puVar2 = TArray<unsigned_char,_unsigned_char>::operator[](&this->savedmapsection,0);
  __src = TArray<unsigned_char,_unsigned_char>::operator[](&currentmapsection,0);
  uVar1 = TArray<unsigned_char,_unsigned_char>::Size(&currentmapsection);
  memcpy(puVar2,__src,(ulong)uVar1);
  puVar2 = TArray<unsigned_char,_unsigned_char>::operator[](&currentmapsection,0);
  uVar1 = TArray<unsigned_char,_unsigned_char>::Size(&currentmapsection);
  memset(puVar2,0,(ulong)uVar1);
  return;
}

Assistant:

void GLPortal::SaveMapSection()
{
	savedmapsection.Resize(currentmapsection.Size());
	memcpy(&savedmapsection[0], &currentmapsection[0], currentmapsection.Size());
	memset(&currentmapsection[0], 0, currentmapsection.Size());
}